

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replace_desc_array_access_using_var_index.cpp
# Opt level: O0

Instruction * __thiscall
spvtools::opt::ReplaceDescArrayAccessUsingVarIndex::GetConstNull
          (ReplaceDescArrayAccessUsingVarIndex *this,uint32_t type_id)

{
  IRContext *pIVar1;
  TypeManager *this_00;
  ConstantManager *pCVar2;
  Constant *pCVar3;
  Instruction *pIVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_40;
  Constant *local_28;
  Constant *null_const;
  Type *type;
  ReplaceDescArrayAccessUsingVarIndex *pRStack_10;
  uint32_t type_id_local;
  ReplaceDescArrayAccessUsingVarIndex *this_local;
  
  type._4_4_ = type_id;
  pRStack_10 = this;
  if (type_id == 0) {
    __assert_fail("type_id != 0 && \"Result type is expected\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/replace_desc_array_access_using_var_index.cpp"
                  ,0x17a,
                  "Instruction *spvtools::opt::ReplaceDescArrayAccessUsingVarIndex::GetConstNull(uint32_t) const"
                 );
  }
  pIVar1 = Pass::context(&this->super_Pass);
  this_00 = IRContext::get_type_mgr(pIVar1);
  null_const = (Constant *)analysis::TypeManager::GetType(this_00,type._4_4_);
  pIVar1 = Pass::context(&this->super_Pass);
  pCVar2 = IRContext::get_constant_mgr(pIVar1);
  pCVar3 = null_const;
  memset(&local_40,0,0x18);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_40);
  pCVar3 = analysis::ConstantManager::GetConstant(pCVar2,(Type *)pCVar3,&local_40);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_40);
  local_28 = pCVar3;
  pIVar1 = Pass::context(&this->super_Pass);
  pCVar2 = IRContext::get_constant_mgr(pIVar1);
  pIVar4 = analysis::ConstantManager::GetDefiningInstruction(pCVar2,local_28,0,(inst_iterator *)0x0)
  ;
  return pIVar4;
}

Assistant:

Instruction* ReplaceDescArrayAccessUsingVarIndex::GetConstNull(
    uint32_t type_id) const {
  assert(type_id != 0 && "Result type is expected");
  auto* type = context()->get_type_mgr()->GetType(type_id);
  auto* null_const = context()->get_constant_mgr()->GetConstant(type, {});
  return context()->get_constant_mgr()->GetDefiningInstruction(null_const);
}